

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O3

void aom_paeth_predictor_32x32_avx2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  int iVar10;
  uint8_t *puVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 in_ZMM9 [64];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  
  auVar2 = vpmovzxbw_avx(*(undefined1 (*) [16])above);
  auVar3 = vpunpckhbw_avx(*(undefined1 (*) [16])above,(undefined1  [16])0x0);
  auVar12._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar2;
  auVar12._16_16_ = ZEXT116(1) * auVar3;
  auVar2 = vpmovzxbw_avx(*(undefined1 (*) [16])(above + 0x10));
  auVar3 = vpunpckhbw_avx(*(undefined1 (*) [16])(above + 0x10),(undefined1  [16])0x0);
  auVar13._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar2;
  auVar13._16_16_ = ZEXT116(1) * auVar3;
  bVar1 = above[-1];
  auVar14[1] = 0;
  auVar14[0] = bVar1;
  auVar14[2] = bVar1;
  auVar14[3] = 0;
  auVar14[4] = bVar1;
  auVar14[5] = 0;
  auVar14[6] = bVar1;
  auVar14[7] = 0;
  auVar14[8] = bVar1;
  auVar14[9] = 0;
  auVar14[10] = bVar1;
  auVar14[0xb] = 0;
  auVar14[0xc] = bVar1;
  auVar14[0xd] = 0;
  auVar14[0xe] = bVar1;
  auVar14[0xf] = 0;
  auVar14[0x10] = bVar1;
  auVar14[0x11] = 0;
  auVar14[0x12] = bVar1;
  auVar14[0x13] = 0;
  auVar14[0x14] = bVar1;
  auVar14[0x15] = 0;
  auVar14[0x16] = bVar1;
  auVar14[0x17] = 0;
  auVar14[0x18] = bVar1;
  auVar14[0x19] = 0;
  auVar14[0x1a] = bVar1;
  auVar14[0x1b] = 0;
  auVar14[0x1c] = bVar1;
  auVar14[0x1d] = 0;
  auVar14[0x1e] = bVar1;
  auVar14[0x1f] = 0;
  auVar15._16_16_ = *(undefined1 (*) [16])left;
  auVar15._0_16_ = *(undefined1 (*) [16])left;
  auVar8 = vpsubw_avx2(auVar12,auVar14);
  auVar4 = vpabsw_avx2(auVar8);
  auVar9 = vpsubw_avx2(auVar13,auVar14);
  auVar5 = vpabsw_avx2(auVar9);
  puVar11 = dst + 0x10;
  auVar17._8_8_ = 0x8000800080008000;
  auVar17._0_8_ = 0x8000800080008000;
  auVar17._16_8_ = 0x8000800080008000;
  auVar17._24_8_ = 0x8000800080008000;
  iVar10 = 0x10;
  auVar6 = vpcmpeqd_avx2(in_ZMM9._0_32_,in_ZMM9._0_32_);
  do {
    auVar20 = vpshufb_avx2(auVar15,auVar17);
    auVar16 = vpaddw_avx2(auVar20,auVar8);
    auVar18 = vpsubw_avx2(auVar16,auVar12);
    auVar18 = vpabsw_avx2(auVar18);
    auVar16 = vpsubw_avx2(auVar16,auVar14);
    auVar16 = vpabsw_avx2(auVar16);
    auVar19 = vpminsw_avx2(auVar18,auVar16);
    auVar18 = vpcmpgtw_avx2(auVar18,auVar16);
    auVar19 = vpcmpgtw_avx2(auVar4,auVar19);
    auVar16 = vpandn_avx2(auVar19,auVar20);
    auVar18 = vpblendvb_avx2(auVar12,auVar14,auVar18);
    auVar18 = vpand_avx2(auVar19,auVar18);
    auVar7 = vpor_avx2(auVar16,auVar18);
    auVar16 = vpaddw_avx2(auVar20,auVar9);
    auVar18 = vpsubw_avx2(auVar16,auVar13);
    auVar18 = vpabsw_avx2(auVar18);
    auVar16 = vpsubw_avx2(auVar16,auVar14);
    auVar16 = vpabsw_avx2(auVar16);
    auVar19 = vpminsw_avx2(auVar18,auVar16);
    auVar18 = vpcmpgtw_avx2(auVar18,auVar16);
    auVar19 = vpcmpgtw_avx2(auVar5,auVar19);
    auVar16 = vpandn_avx2(auVar19,auVar20);
    auVar18 = vpblendvb_avx2(auVar13,auVar14,auVar18);
    auVar18 = vpand_avx2(auVar19,auVar18);
    auVar18 = vpor_avx2(auVar16,auVar18);
    auVar16 = vperm2i128_avx2(auVar7,auVar18,0x31);
    auVar19._0_16_ = ZEXT116(0) * auVar18._0_16_ + ZEXT116(1) * auVar7._0_16_;
    auVar19._16_16_ = ZEXT116(0) * auVar7._16_16_ + ZEXT116(1) * auVar18._0_16_;
    auVar18 = vpackuswb_avx2(auVar19,auVar16);
    *(undefined1 (*) [32])(puVar11 + -0x10) = auVar18;
    auVar17 = vpsubw_avx2(auVar17,auVar6);
    puVar11 = puVar11 + stride;
    iVar10 = iVar10 + -1;
  } while (iVar10 != 0);
  auVar16._16_16_ = *(undefined1 (*) [16])(left + 0x10);
  auVar16._0_16_ = *(undefined1 (*) [16])(left + 0x10);
  auVar18._8_8_ = 0x8000800080008000;
  auVar18._0_8_ = 0x8000800080008000;
  auVar18._16_8_ = 0x8000800080008000;
  auVar18._24_8_ = 0x8000800080008000;
  iVar10 = 0x10;
  auVar6 = vpcmpeqd_avx2(auVar6,auVar6);
  do {
    auVar20 = vpshufb_avx2(auVar16,auVar18);
    auVar15 = vpaddw_avx2(auVar20,auVar8);
    auVar17 = vpsubw_avx2(auVar15,auVar12);
    auVar17 = vpabsw_avx2(auVar17);
    auVar15 = vpsubw_avx2(auVar15,auVar14);
    auVar15 = vpabsw_avx2(auVar15);
    auVar19 = vpminsw_avx2(auVar17,auVar15);
    auVar17 = vpcmpgtw_avx2(auVar17,auVar15);
    auVar19 = vpcmpgtw_avx2(auVar4,auVar19);
    auVar15 = vpandn_avx2(auVar19,auVar20);
    auVar17 = vpblendvb_avx2(auVar12,auVar14,auVar17);
    auVar17 = vpand_avx2(auVar19,auVar17);
    auVar7 = vpor_avx2(auVar15,auVar17);
    auVar15 = vpaddw_avx2(auVar20,auVar9);
    auVar17 = vpsubw_avx2(auVar15,auVar13);
    auVar17 = vpabsw_avx2(auVar17);
    auVar15 = vpsubw_avx2(auVar15,auVar14);
    auVar15 = vpabsw_avx2(auVar15);
    auVar19 = vpminsw_avx2(auVar17,auVar15);
    auVar17 = vpcmpgtw_avx2(auVar17,auVar15);
    auVar19 = vpcmpgtw_avx2(auVar5,auVar19);
    auVar15 = vpandn_avx2(auVar19,auVar20);
    auVar17 = vpblendvb_avx2(auVar13,auVar14,auVar17);
    auVar17 = vpand_avx2(auVar19,auVar17);
    auVar17 = vpor_avx2(auVar15,auVar17);
    auVar15 = vperm2i128_avx2(auVar7,auVar17,0x31);
    auVar20._0_16_ = ZEXT116(0) * auVar17._0_16_ + ZEXT116(1) * auVar7._0_16_;
    auVar20._16_16_ = ZEXT116(0) * auVar7._16_16_ + ZEXT116(1) * auVar17._0_16_;
    auVar17 = vpackuswb_avx2(auVar20,auVar15);
    *(undefined1 (*) [32])(puVar11 + -0x10) = auVar17;
    auVar18 = vpsubw_avx2(auVar18,auVar6);
    puVar11 = puVar11 + stride;
    iVar10 = iVar10 + -1;
  } while (iVar10 != 0);
  return;
}

Assistant:

void aom_paeth_predictor_32x32_avx2(uint8_t *dst, ptrdiff_t stride,
                                    const uint8_t *above, const uint8_t *left) {
  __m256i l = get_left_vector(left);
  const __m256i t0 = get_top_vector(above);
  const __m256i t1 = get_top_vector(above + 16);
  const __m256i tl = _mm256_set1_epi16((int16_t)above[-1]);
  __m256i rep = _mm256_set1_epi16((short)0x8000);
  const __m256i one = _mm256_set1_epi16(1);

  int i;
  for (i = 0; i < 16; ++i) {
    const __m256i l16 = _mm256_shuffle_epi8(l, rep);

    const __m128i r0 = paeth_16x1_pred(&l16, &t0, &tl);
    const __m128i r1 = paeth_16x1_pred(&l16, &t1, &tl);

    _mm_store_si128((__m128i *)dst, r0);
    _mm_store_si128((__m128i *)(dst + 16), r1);

    dst += stride;
    rep = _mm256_add_epi16(rep, one);
  }

  l = get_left_vector(left + 16);
  rep = _mm256_set1_epi16((short)0x8000);
  for (i = 0; i < 16; ++i) {
    const __m256i l16 = _mm256_shuffle_epi8(l, rep);

    const __m128i r0 = paeth_16x1_pred(&l16, &t0, &tl);
    const __m128i r1 = paeth_16x1_pred(&l16, &t1, &tl);

    _mm_store_si128((__m128i *)dst, r0);
    _mm_store_si128((__m128i *)(dst + 16), r1);

    dst += stride;
    rep = _mm256_add_epi16(rep, one);
  }
}